

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_226::GlobalTypeOptimization::run(GlobalTypeOptimization *this,Module *module)

{
  __node_base_ptr *this_00;
  bool bVar1;
  value_type vVar2;
  PassOptions *pPVar3;
  PassRunner *pPVar4;
  reference pHVar5;
  Struct *this_01;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_02;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_03;
  size_type sVar6;
  const_reference pvVar7;
  FieldInfo *pFVar8;
  mapped_type *this_04;
  ulong uVar9;
  mapped_type *this_05;
  size_type sVar10;
  reference pvVar11;
  reference rVar12;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar13;
  key_type local_4d0;
  int local_4cc;
  Index i_3;
  Index skip;
  mapped_type *indexesAfterRemoval;
  undefined1 local_4b8;
  value_type_conflict2 local_4b0;
  value_type_conflict2 local_4ac;
  _Rb_tree_const_iterator<unsigned_int> _Stack_4a8;
  int i_2;
  undefined1 local_4a0;
  value_type_conflict2 local_494;
  undefined1 local_490 [4];
  Index i_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> removableIndexes;
  mapped_type *vec;
  Index i;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *sub;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *subSuper;
  FieldList *fields;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  type subs;
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> subSupers;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> propagator;
  FieldInfoScanner scanner;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionSetGetInfos;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionNewInfos;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  GlobalTypeOptimization *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    pPVar3 = Pass::getPassOptions(&this->super_Pass);
    if ((pPVar3->closedWorld & 1U) == 0) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,(char (*) [28])"GTO requires --closed-world");
      Fatal::~Fatal(&local_1a0);
    }
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,local_18);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos,local_18);
    FieldInfoScanner::FieldInfoScanner
              ((FieldInfoScanner *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,
               (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos);
    pPVar4 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,pPVar4,local_18);
    pPVar4 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                       *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,pPVar4,local_18);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::combineInto
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos,&this->combinedSetGetInfos);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
               &subSupers.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,local_18);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &subs.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,&this->combinedSetGetInfos);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    propagateToSuperAndSubTypes
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
               &subSupers.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket,
               (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &subs.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)&__range2,
               &this->combinedSetGetInfos);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    propagateToSubTypes((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
                        &subSupers.
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                         ._M_h._M_single_bucket,
                        (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)&__range2);
    this_00 = &subSupers.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_single_bucket;
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&type), bVar1) {
      pHVar5 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
      fields = (FieldList *)pHVar5->id;
      bVar1 = HeapType::isStruct((HeapType *)&fields);
      if (bVar1) {
        this_01 = HeapType::getStruct((HeapType *)&fields);
        this_02 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
                             &subs.
                              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                              ._M_h._M_single_bucket,(HeapType)fields);
        this_03 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)&__range2,
                             (HeapType)fields);
        for (vec._4_4_ = 0;
            sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_01->fields),
            vec._4_4_ < sVar6; vec._4_4_ = vec._4_4_ + 1) {
          pvVar7 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                             (&this_01->fields,(ulong)vec._4_4_);
          if ((pvVar7->mutable_ != Immutable) &&
             (pFVar8 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                                 (this_02,(ulong)vec._4_4_), (pFVar8->hasWrite & 1U) == 0)) {
            this_04 = std::
                      unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                      ::operator[](&this->canBecomeImmutable,(key_type *)&fields);
            std::vector<bool,_std::allocator<bool>_>::resize(this_04,(ulong)(vec._4_4_ + 1),false);
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_04,(ulong)vec._4_4_);
            removableIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rVar12._M_p;
            std::_Bit_reference::operator=
                      ((_Bit_reference *)
                       &removableIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
          }
        }
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_490);
        for (local_494 = 0; uVar9 = (ulong)local_494,
            sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_01->fields),
            uVar9 < sVar6; local_494 = local_494 + 1) {
          pFVar8 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                             (this_02,(ulong)local_494);
          if ((pFVar8->hasRead & 1U) == 0) {
            pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_490,&local_494);
            _Stack_4a8 = pVar13.first._M_node;
            local_4a0 = pVar13.second;
          }
        }
        sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_01->fields);
        local_4ac = (value_type_conflict2)sVar6;
        while (((local_4ac = local_4ac - 1, -1 < (int)local_4ac &&
                (pFVar8 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::
                          operator[](this_03,(long)(int)local_4ac), (pFVar8->hasRead & 1U) == 0)) &&
               (pFVar8 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::
                         operator[](this_03,(long)(int)local_4ac), (pFVar8->hasWrite & 1U) == 0))) {
          local_4b0 = local_4ac;
          pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_490,&local_4b0);
          indexesAfterRemoval = (mapped_type *)pVar13.first._M_node;
          local_4b8 = pVar13.second;
        }
        bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                empty((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      local_490);
        if (!bVar1) {
          this_05 = std::
                    unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&this->indexesAfterRemovals,(key_type *)&fields);
          _i_3 = this_05;
          sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_01->fields);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_05,sVar6);
          local_4cc = 0;
          for (local_4d0 = 0; uVar9 = (ulong)local_4d0,
              sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_01->fields)
              , uVar9 < sVar6; local_4d0 = local_4d0 + 1) {
            sVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_490,&local_4d0);
            if (sVar10 == 0) {
              vVar2 = local_4d0 - local_4cc;
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (_i_3,(ulong)local_4d0);
              *pvVar11 = vVar2;
            }
            else {
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (_i_3,(ulong)local_4d0);
              *pvVar11 = 0xffffffff;
              local_4cc = local_4cc + 1;
            }
          }
        }
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_490);
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    bVar1 = std::
            unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::empty(&this->indexesAfterRemovals);
    if (!bVar1) {
      removeFieldsInInstructions(this,local_18);
    }
    bVar1 = std::
            unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::empty(&this->indexesAfterRemovals);
    if ((!bVar1) ||
       (bVar1 = std::
                unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                ::empty(&this->canBecomeImmutable), !bVar1)) {
      updateTypes(this,local_18);
    }
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::~StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)&__range2);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::~StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &subs.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::
    ~TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
               &subSupers.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
    FieldInfoScanner::~FieldInfoScanner
              ((FieldInfoScanner *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    ~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &scanner.
                super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                .functionSetGetInfos);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
    ~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
               &functionSetGetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GTO requires --closed-world";
    }

    // Find and analyze struct operations inside each function.
    StructUtils::FunctionStructValuesMap<FieldInfo> functionNewInfos(*module),
      functionSetGetInfos(*module);
    FieldInfoScanner scanner(functionNewInfos, functionSetGetInfos);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Combine the data from the functions.
    functionSetGetInfos.combineInto(combinedSetGetInfos);
    // TODO: combine newInfos as well, once we have a need for that (we will
    //       when we do things like subtyping).

    // Propagate information to super and subtypes on set/get infos:
    //
    //  * For removing unread fields, we can only remove a field if it is never
    //    read in any sub or supertype, as such a read may alias any of those
    //    types (where the field is present).
    //
    //    Note that we *can* propagate reads only to supertypes, but we are
    //    limited in what we optimize. If type A has fields {a, b}, and its
    //    subtype B has the same fields, and if field a is only used in reads of
    //    type B, then we still cannot remove it. If we removed it then A would
    //    have fields {b}, that is, field b would be at index 0, while type B
    //    would still be {a, b} which has field b at index 1, which is not
    //    compatible. The only case in which we can optimize is to remove a
    //    field from the end, that is, we could remove field b from A.
    //    Otherwise, as mentioned before we can only remove a field if we also
    //    remove it from all sub- and super-types.
    //
    //  * For immutability, this is necessary because we cannot have a
    //    supertype's field be immutable while a subtype's is not - they must
    //    match for us to preserve subtyping.
    //
    //    Note that we do not need to care about types here: If the fields were
    //    mutable before, then they must have had identical types for them to be
    //    subtypes (as wasm only allows the type to differ if the fields are
    //    immutable). Note that by making more things immutable we therefore
    //    make it possible to apply more specific subtypes in subtype fields.
    StructUtils::TypeHierarchyPropagator<FieldInfo> propagator(*module);
    auto subSupers = combinedSetGetInfos;
    propagator.propagateToSuperAndSubTypes(subSupers);
    auto subs = std::move(combinedSetGetInfos);
    propagator.propagateToSubTypes(subs);

    // Process the propagated info.
    for (auto type : propagator.subTypes.types) {
      if (!type.isStruct()) {
        continue;
      }
      auto& fields = type.getStruct().fields;
      auto& subSuper = subSupers[type];
      auto& sub = subs[type];

      // Process immutability.
      for (Index i = 0; i < fields.size(); i++) {
        if (fields[i].mutable_ == Immutable) {
          // Already immutable; nothing to do.
          continue;
        }

        if (subSuper[i].hasWrite) {
          // A set exists.
          continue;
        }

        // No set exists. Mark it as something we can make immutable.
        auto& vec = canBecomeImmutable[type];
        vec.resize(i + 1);
        vec[i] = true;
      }

      // Process removability. We check separately for the ability to
      // remove in a general way based on sub+super-propagated info (that is,
      // fields that are not used in sub- or super-types, and so we can
      // definitely remove them from all the relevant types) and also in the
      // specific way that only works for removing at the end, which as
      // mentioned above only looks at super-types.
      std::set<Index> removableIndexes;
      for (Index i = 0; i < fields.size(); i++) {
        if (!subSuper[i].hasRead) {
          removableIndexes.insert(i);
        }
      }
      for (int i = int(fields.size()) - 1; i >= 0; i--) {
        // Unlike above, a write would stop us here: above we propagated to both
        // sub- and super-types, which means if we see no reads then there is no
        // possible read of the data at all. But here we just propagated to
        // subtypes, and so we need to care about the case where the parent
        // writes to a field but does not read from it - we still need those
        // writes to happen as children may read them. (Note that if no child
        // reads this field, and since we check for reads in parents here, that
        // means the field is not read anywhere at all, and we would have
        // handled that case in the previous loop anyhow.)
        if (!sub[i].hasRead && !sub[i].hasWrite) {
          removableIndexes.insert(i);
        } else {
          // Once we see something we can't remove, we must stop, as we can only
          // remove from the end in this case.
          break;
        }
      }
      if (!removableIndexes.empty()) {
        auto& indexesAfterRemoval = indexesAfterRemovals[type];
        indexesAfterRemoval.resize(fields.size());
        Index skip = 0;
        for (Index i = 0; i < fields.size(); i++) {
          if (!removableIndexes.count(i)) {
            indexesAfterRemoval[i] = i - skip;
          } else {
            indexesAfterRemoval[i] = RemovedField;
            skip++;
          }
        }
      }
    }

    // If we found fields that can be removed, remove them from instructions.
    // (Note that we must do this first, while we still have the old heap types
    // that we can identify, and only after this should we update all the types
    // throughout the module.)
    if (!indexesAfterRemovals.empty()) {
      removeFieldsInInstructions(*module);
    }

    // Update the types in the entire module.
    if (!indexesAfterRemovals.empty() || !canBecomeImmutable.empty()) {
      updateTypes(*module);
    }
  }